

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O0

int nghttp2_check_header_name(uint8_t *name,size_t len)

{
  uint8_t *puVar1;
  uint8_t *last;
  size_t len_local;
  uint8_t *name_local;
  
  if (len == 0) {
    name_local._4_4_ = 0;
  }
  else {
    last = (uint8_t *)len;
    len_local = (size_t)name;
    if (*name == ':') {
      if (len == 1) {
        return 0;
      }
      len_local = (size_t)(name + 1);
      last = (uint8_t *)(len - 1);
    }
    puVar1 = last + len_local;
    for (; (uint8_t *)len_local != puVar1; len_local = len_local + 1) {
      if (VALID_HD_NAME_CHARS[*(byte *)len_local] == 0) {
        return 0;
      }
    }
    name_local._4_4_ = 1;
  }
  return name_local._4_4_;
}

Assistant:

int nghttp2_check_header_name(const uint8_t *name, size_t len) {
  const uint8_t *last;
  if (len == 0) {
    return 0;
  }
  if (*name == ':') {
    if (len == 1) {
      return 0;
    }
    ++name;
    --len;
  }
  for (last = name + len; name != last; ++name) {
    if (!VALID_HD_NAME_CHARS[*name]) {
      return 0;
    }
  }
  return 1;
}